

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLineCam::ChLineCam(ChLineCam *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  _Var3 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChLineCam_0118a180;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> = _Var3;
  (this->center).m_data[2] = 0.0;
  (this->center).m_data[0] = (double)_Var3._M_ptr;
  (this->center).m_data[1] = (double)_Var3._M_refcount._M_pi;
  *(undefined8 *)&(this->super_ChLine).complexityU = 10;
  (this->super_ChLine).closed = true;
  this->Rb = 1.0;
  this->Rr = 0.0;
  this->p = 1.8;
  this->d = 2.0;
  this->b0 = 0.5235987755982988;
  dVar2 = DAT_011dd3e0;
  if (this != (ChLineCam *)(Q_ROTATE_Z_TO_X + 0x18)) {
    (this->center).m_data[0] = VNULL;
    (this->center).m_data[1] = dVar2;
    (this->center).m_data[2] = DAT_011dd3e8;
  }
  auVar1 = vmovhps_avx((undefined1  [16])_Var3,0x3ff0000000000000);
  this->e = (double)auVar1._0_8_;
  this->s = (double)auVar1._8_8_;
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->law,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  this->negative = false;
  this->internal = false;
  return;
}

Assistant:

ChLineCam::ChLineCam() {
    Set_complexity(10);
    this->closed = true;
    type = CAM_TYPE_SLIDEFOLLOWER;
    Rb = 1.0;
    Rr = 0.0;
    p = 1.8;
    d = 2;
    b0 = CH_C_PI / 6.0;
    center = VNULL;
    e = 0;
    s = Rb;
    law = chrono_types::make_shared<ChFunction_Const>(0);  // default law = no follower motion
    negative = false;
    internal = false;
}